

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int schema_nodeid_siblingcheck
              (lys_node *sibling,int8_t *shorthand,char *id,lys_module *module,char *mod_name,
              int mod_name_len,int implemented_mod,lys_node **start_parent)

{
  lys_module *mod;
  lys_module *plVar1;
  lys_node *plVar2;
  uint uVar3;
  
  mod = lys_get_import_module(module,(char *)0x0,0,mod_name,mod_name_len);
  if (implemented_mod != 0 && mod != (lys_module *)0x0) {
    mod = lys_implemented_module(mod);
  }
  uVar3 = 0xffffffff;
  if (mod != (lys_module *)0x0) {
    plVar1 = lys_node_module(sibling);
    if (mod == plVar1) {
      plVar2 = lys_parent(sibling);
      if ((((plVar2 != (lys_node *)0x0) &&
           (plVar2 = lys_parent(sibling), plVar2->nodetype == LYS_CHOICE)) &&
          (sibling->nodetype != LYS_CASE)) && (*shorthand != -1)) {
        *shorthand = *shorthand == '\0';
      }
      if (*id == '\0') {
        uVar3 = (uint)(*shorthand == '\x01');
      }
      else {
        if (*shorthand == '\0') {
          if ((sibling->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            return -1;
          }
          *start_parent = sibling;
        }
        uVar3 = 2;
      }
    }
    else {
      uVar3 = 1;
    }
  }
  return uVar3;
}

Assistant:

static int
schema_nodeid_siblingcheck(const struct lys_node *sibling, int8_t *shorthand, const char *id,
                           const struct lys_module *module, const char *mod_name, int mod_name_len,
                           int implemented_mod, const struct lys_node **start_parent)
{
    const struct lys_module *prefix_mod;

    /* module check */
    prefix_mod = lys_get_import_module(module, NULL, 0, mod_name, mod_name_len);
    if (prefix_mod && implemented_mod) {
        prefix_mod = lys_implemented_module(prefix_mod);
    }
    if (!prefix_mod) {
        return -1;
    }
    if (prefix_mod != lys_node_module(sibling)) {
        return 1;
    }

    /* check for shorthand cases - then 'start' does not change */
    if (lys_parent(sibling) && (lys_parent(sibling)->nodetype == LYS_CHOICE) && (sibling->nodetype != LYS_CASE)) {
        if (*shorthand != -1) {
            *shorthand = *shorthand ? 0 : 1;
        }
    }

    /* the result node? */
    if (!id[0]) {
        if (*shorthand == 1) {
            return 1;
        }
        return 0;
    }

    if (!(*shorthand)) {
        /* move down the tree, if possible */
        if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            return -1;
        }
        *start_parent = sibling;
    }

    return 2;
}